

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O1

void KeccakP1600Round(tKeccakLane *state,uint indexRound)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  uint *puVar5;
  tKeccakLane *ptVar6;
  ulong uVar7;
  ulong uVar8;
  tKeccakLane *ptVar9;
  int iVar10;
  long lVar11;
  uint x;
  int iVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong auStack_128 [6];
  tKeccakLane local_f8 [15];
  tKeccakLane D [5];
  tKeccakLane C [5];
  
  lVar4 = 0;
  ptVar6 = state;
  do {
    local_f8[lVar4] = 0;
    lVar11 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 ^ *(ulong *)((long)ptVar6 + lVar11);
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 200);
    local_f8[lVar4] = uVar8;
    lVar4 = lVar4 + 1;
    ptVar6 = ptVar6 + 1;
  } while (lVar4 != 5);
  uVar8 = 4;
  lVar4 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    lVar11 = lVar4 + 1;
    lVar14 = 0;
    if (lVar4 != 4) {
      lVar14 = lVar11;
    }
    auStack_128[lVar4] =
         (local_f8[lVar14] << 1 | (ulong)((long)local_f8[lVar14] < 0)) ^
         *(ulong *)((long)local_f8 +
                   lVar4 * 8 +
                   (SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff8U) * -5 +
                   0x20);
    uVar8 = uVar8 + 1;
    lVar4 = lVar11;
  } while (lVar11 != 5);
  lVar4 = 0;
  ptVar6 = state;
  do {
    uVar8 = auStack_128[lVar4];
    lVar11 = 0;
    do {
      *(ulong *)((long)ptVar6 + lVar11) = *(ulong *)((long)ptVar6 + lVar11) ^ uVar8;
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 200);
    lVar4 = lVar4 + 1;
    ptVar6 = ptVar6 + 1;
  } while (lVar4 != 5);
  puVar5 = KeccakRhoOffsets;
  lVar4 = 0;
  lVar11 = 0;
  do {
    lVar14 = 0;
    do {
      if ((int)lVar14 == 0 && (int)lVar11 == 0) {
        uVar8 = state[lVar14];
      }
      else {
        uVar8 = *(ulong *)((long)state + lVar14 * 8 + lVar4);
        uVar8 = uVar8 >> (-(byte)puVar5[lVar14] & 0x3f) ^ uVar8 << ((byte)puVar5[lVar14] & 0x3f);
      }
      *(ulong *)((long)state + lVar14 * 8 + lVar4) = uVar8;
      lVar14 = lVar14 + 5;
    } while (lVar14 != 0x19);
    lVar11 = lVar11 + 1;
    lVar4 = lVar4 + 8;
    puVar5 = puVar5 + 1;
  } while (lVar11 != 5);
  ptVar6 = local_f8;
  lVar4 = 0;
  ptVar9 = state;
  do {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)ptVar6 + lVar11) = *(undefined8 *)((long)ptVar9 + lVar11);
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 200);
    lVar4 = lVar4 + 1;
    ptVar6 = ptVar6 + 1;
    ptVar9 = ptVar9 + 1;
  } while (lVar4 != 5);
  uVar3 = 0;
  ptVar6 = local_f8;
  iVar12 = 0;
  lVar4 = 0;
  do {
    lVar11 = 0;
    ptVar9 = state;
    iVar10 = iVar12;
    uVar13 = uVar3;
    do {
      ptVar9[iVar10 + (uVar13 / 5) * -0x19] = ptVar6[lVar11];
      lVar11 = lVar11 + 5;
      ptVar9 = ptVar9 + 1;
      iVar10 = iVar10 + 0xf;
      uVar13 = uVar13 + 3;
    } while (lVar11 != 0x19);
    lVar4 = lVar4 + 1;
    iVar12 = iVar12 + 10;
    uVar3 = uVar3 + 2;
    ptVar6 = ptVar6 + 1;
  } while (lVar4 != 5);
  ptVar6 = state + 2;
  uVar8 = 0;
  ptVar9 = state;
  do {
    uVar15 = (ulong)(uint)((int)uVar8 * 5 + (int)((uVar8 & 0xffffffff) / 5) * -0x19);
    uVar7 = 2;
    lVar4 = 0;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      lVar11 = lVar4 + 1;
      lVar14 = 0;
      if (lVar4 != 4) {
        lVar14 = lVar11;
      }
      local_f8[lVar4] =
           ~state[uVar8 * 5 + lVar14] &
           *(ulong *)((long)ptVar6 +
                     lVar4 * 8 +
                     (SUB168(auVar2 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff8U) * -5
                     ) ^ ptVar9[lVar4];
      uVar7 = uVar7 + 1;
      lVar4 = lVar11;
    } while (lVar11 != 5);
    state[uVar15 + 4] = local_f8[4];
    state[uVar15 + 2] = local_f8[2];
    (state + uVar15 + 2)[1] = local_f8[3];
    state[uVar15] = local_f8[0];
    (state + uVar15)[1] = local_f8[1];
    uVar8 = uVar8 + 1;
    ptVar9 = ptVar9 + 5;
    ptVar6 = ptVar6 + 5;
  } while (uVar8 != 5);
  *state = *state ^ KeccakRoundConstants[indexRound];
  return;
}

Assistant:

void KeccakP1600Round(tKeccakLane *state, unsigned int indexRound)
{
#ifdef KeccakReference
    displayRoundNumber(3, indexRound);
#endif

    theta(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After theta", state, 1600);
#endif

    rho(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After rho", state, 1600);
#endif

    pi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After pi", state, 1600);
#endif

    chi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After chi", state, 1600);
#endif

    iota(state, indexRound);
#ifdef KeccakReference
    displayStateAsLanes(3, "After iota", state, 1600);
#endif
}